

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O0

void glcts::CullDistance::Utilities::buildProgram
               (Functions *gl,TestContext *testCtx,GLchar *cs_body,GLchar *fs_body,GLchar *gs_body,
               GLchar *tc_body,GLchar *te_body,GLchar *vs_body,GLuint *n_tf_varyings,
               GLchar **tf_varyings,GLuint *out_program)

{
  glGetShaderInfoLogFunc p_Var1;
  glGetProgramInfoLogFunc p_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  GLuint GVar5;
  GLenum GVar6;
  GLuint GVar7;
  reference pvVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  TestError *pTVar11;
  GLuint so_id_2;
  GLuint n_shader_index_3;
  GLuint so_id_1;
  GLuint n_shader_index_2;
  uint local_4e4;
  undefined1 local_4e0 [4];
  GLuint n_shader_index_1;
  allocator<char> local_359;
  string local_358 [39];
  value_type local_331;
  undefined1 local_330 [8];
  string log_string_1;
  GLsizei log_length_1;
  vector<char,_std::allocator<char>_> log_array_1;
  undefined1 local_2e8 [4];
  GLint link_status;
  allocator<char> local_161;
  string local_160 [38];
  value_type local_13a;
  allocator<char> local_139;
  undefined1 local_138 [8];
  string log_string;
  GLint log_length;
  vector<char,_std::allocator<char>_> log_array;
  GLuint so_id;
  GLint compile_status;
  GLuint n_shader_index;
  GLenum local_d8;
  GLuint n_shaders_configuration;
  _shaders_configuration shaders_configuration [6];
  GLuint po_id;
  GLchar *tc_body_local;
  GLchar *gs_body_local;
  GLchar *fs_body_local;
  GLchar *cs_body_local;
  TestContext *testCtx_local;
  Functions *gl_local;
  
  local_d8 = 0x91b9;
  shaders_configuration[0].body._0_4_ = 0;
  shaders_configuration[0].id = 0x8b30;
  shaders_configuration[1].body._0_4_ = 0;
  shaders_configuration[1].id = 0x8dd9;
  shaders_configuration[2].body._0_4_ = 0;
  shaders_configuration[2].id = 0x8e88;
  shaders_configuration[3].body._0_4_ = 0;
  shaders_configuration[3].id = 0x8e87;
  shaders_configuration[4]._0_8_ = te_body;
  shaders_configuration[4].body._0_4_ = 0;
  shaders_configuration[4].id = 0x8b31;
  shaders_configuration[5]._0_8_ = vs_body;
  shaders_configuration[5].body._0_4_ = 0;
  shaders_configuration[0]._0_8_ = cs_body;
  shaders_configuration[1]._0_8_ = fs_body;
  shaders_configuration[2]._0_8_ = gs_body;
  shaders_configuration[3]._0_8_ = tc_body;
  GVar5 = (*gl->createProgram)();
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                  ,0x5d);
  so_id = 0;
  do {
    if (5 < so_id) {
      if (*n_tf_varyings != 0) {
        (*gl->transformFeedbackVaryings)(GVar5,*n_tf_varyings,tf_varyings,0x8c8c);
        GVar6 = (*gl->getError)();
        glu::checkError(GVar6,"glTransformFeedbackVaryings() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x9c);
      }
      if (GVar5 != 0) {
        log_array_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
        (*gl->linkProgram)(GVar5);
        GVar6 = (*gl->getError)();
        glu::checkError(GVar6,"glLinkProgram() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xa5);
        (*gl->getProgramiv)(GVar5,0x8b82,
                            (GLint *)&log_array_1.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.field_0x14);
        GVar6 = (*gl->getError)();
        glu::checkError(GVar6,"glGetProgramiv() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xa8);
        if (log_array_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0) {
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&log_length_1,1,
                     (allocator_type *)(log_string_1.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(log_string_1.field_2._M_local_buf + 0xf));
          log_string_1.field_2._8_4_ = 0;
          std::__cxx11::string::string((string *)local_330);
          (*gl->getProgramiv)(GVar5,0x8b84,(GLint *)(log_string_1.field_2._M_local_buf + 8));
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"glGetProgramiv() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                          ,0xb2);
          local_331 = '\0';
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)&log_length_1,
                     (long)(log_string_1.field_2._8_4_ + 1),&local_331);
          uVar3 = log_string_1.field_2._8_4_;
          p_Var2 = gl->getProgramInfoLog;
          pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)&log_length_1,0);
          (*p_Var2)(GVar5,uVar3,(GLsizei *)0x0,pvVar8);
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"glGetProgramInfoLog() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                          ,0xb8);
          pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)&log_length_1,0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_358,pvVar8,&local_359);
          std::__cxx11::string::operator=((string *)local_330,local_358);
          std::__cxx11::string::~string(local_358);
          std::allocator<char>::~allocator(&local_359);
          pTVar9 = tcu::TestContext::getLog(testCtx);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)local_4e0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar10 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_4e0,
                               (char (*) [29])"Program linking has failed.\n");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [20])"Linking error log:\n");
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_330);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2b9e07b);
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_4e0);
          for (local_4e4 = 0; local_4e4 < 6; local_4e4 = local_4e4 + 1) {
            if (*(long *)(shaders_configuration + local_4e4) != 0) {
              pTVar9 = tcu::TestContext::getLog(testCtx);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&so_id_1,pTVar9,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar10 = tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)&so_id_1,
                                   (char (*) [28])"Shader source code of type ");
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_d8 + (ulong)local_4e4 * 6);
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [11])0x2c3a3d8);
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (pMVar10,(char **)(shaders_configuration + local_4e4));
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2b9e07b);
              tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&so_id_1);
            }
          }
          pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar11,"Program linking failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                     ,0xce);
          __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      for (n_shader_index_3 = 0; n_shader_index_3 < 6; n_shader_index_3 = n_shader_index_3 + 1) {
        if (*(GLuint *)&shaders_configuration[n_shader_index_3].body != 0) {
          (*gl->deleteShader)(*(GLuint *)&shaders_configuration[n_shader_index_3].body);
          *(undefined4 *)&shaders_configuration[n_shader_index_3].body = 0;
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"glDeleteShader() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                          ,0xdd);
        }
      }
      *out_program = GVar5;
      return;
    }
    if (*(long *)(shaders_configuration + so_id) != 0) {
      GVar7 = (*gl->createShader)((&local_d8)[(ulong)so_id * 6]);
      *(GLuint *)&shaders_configuration[so_id].body = GVar7;
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glCreateShader() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x65);
      log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
      log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ =
           *(undefined4 *)&shaders_configuration[so_id].body;
      (*gl->shaderSource)(*(GLuint *)&shaders_configuration[so_id].body,1,
                          (GLchar **)(shaders_configuration + so_id),(GLint *)0x0);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glShaderSource() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x6d);
      (*gl->compileShader)(log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_)
      ;
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x70);
      (*gl->getShaderiv)(log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
                         0x8b81,(GLint *)&log_array.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.field_0x14);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x73);
      if (log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0) {
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&log_length,1,
                   (allocator_type *)(log_string.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(log_string.field_2._M_local_buf + 0xf))
        ;
        log_string.field_2._8_4_ = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_138,"Failed to retrieve log",&local_139);
        std::allocator<char>::~allocator(&local_139);
        (*gl->getShaderiv)(log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
                           0x8b84,(GLint *)(log_string.field_2._M_local_buf + 8));
        GVar6 = (*gl->getError)();
        glu::checkError(GVar6,"glGetShaderiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x7d);
        local_13a = '\0';
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&log_length,
                   (long)(log_string.field_2._8_4_ + 1),&local_13a);
        uVar4 = log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
        uVar3 = log_string.field_2._8_4_;
        p_Var1 = gl->getShaderInfoLog;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)&log_length,0);
        (*p_Var1)(uVar4,uVar3,(GLsizei *)0x0,pvVar8);
        GVar6 = (*gl->getError)();
        glu::checkError(GVar6,"glGetShaderInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x82);
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)&log_length,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_160,pvVar8,&local_161);
        std::__cxx11::string::operator=((string *)local_138,local_160);
        std::__cxx11::string::~string(local_160);
        std::allocator<char>::~allocator(&local_161);
        pTVar9 = tcu::TestContext::getLog(testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_2e8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_2e8,
                             (char (*) [32])"Shader compilation has failed.\n");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [14])"Shader type: ");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_d8 + (ulong)so_id * 6);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2b9e07b);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (pMVar10,(char (*) [31])"Shader compilation error log:\n");
        pMVar10 = tcu::MessageBuilder::operator<<
                            (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_138);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2b9e07b);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [21])"Shader source code:\n");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char **)(shaders_configuration + so_id));
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2b9e07b);
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_2e8);
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar11,"Shader compilation has failed.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                   ,0x8e);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (*gl->attachShader)(GVar5,log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                _16_4_);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glAttachShader() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x94);
    }
    so_id = so_id + 1;
  } while( true );
}

Assistant:

void CullDistance::Utilities::buildProgram(const glw::Functions& gl, tcu::TestContext& testCtx,
										   const glw::GLchar* cs_body, const glw::GLchar* fs_body,
										   const glw::GLchar* gs_body, const glw::GLchar* tc_body,
										   const glw::GLchar* te_body, const glw::GLchar* vs_body,
										   const glw::GLuint& n_tf_varyings, const glw::GLchar** tf_varyings,
										   glw::GLuint* out_program)
{
	glw::GLuint po_id = 0;

	struct _shaders_configuration
	{
		glw::GLenum		   type;
		const glw::GLchar* body;
		glw::GLuint		   id;
	} shaders_configuration[] = { { GL_COMPUTE_SHADER, cs_body, 0 },		 { GL_FRAGMENT_SHADER, fs_body, 0 },
								  { GL_GEOMETRY_SHADER, gs_body, 0 },		 { GL_TESS_CONTROL_SHADER, tc_body, 0 },
								  { GL_TESS_EVALUATION_SHADER, te_body, 0 }, { GL_VERTEX_SHADER, vs_body, 0 } };

	const glw::GLuint n_shaders_configuration = sizeof(shaders_configuration) / sizeof(shaders_configuration[0]);

	/* Guard allocated OpenGL resources */
	try
	{
		/* Create needed programs */
		po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

		for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
		{
			if (shaders_configuration[n_shader_index].body != DE_NULL)
			{
				/* Generate shader object */
				shaders_configuration[n_shader_index].id = gl.createShader(shaders_configuration[n_shader_index].type);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

				glw::GLint		  compile_status = GL_FALSE;
				const glw::GLuint so_id			 = shaders_configuration[n_shader_index].id;

				/* Assign shader source code */
				gl.shaderSource(shaders_configuration[n_shader_index].id, 1,		   /* count */
								&shaders_configuration[n_shader_index].body, DE_NULL); /* length */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

				gl.compileShader(so_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

				gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

				if (compile_status == GL_FALSE)
				{
					std::vector<glw::GLchar> log_array(1);
					glw::GLint				 log_length = 0;
					std::string				 log_string("Failed to retrieve log");

					/* Retrive compilation log length */
					gl.getShaderiv(so_id, GL_INFO_LOG_LENGTH, &log_length);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

					log_array.resize(log_length + 1, 0);

					gl.getShaderInfoLog(so_id, log_length, DE_NULL, &log_array[0]);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog() call failed.");

					log_string = std::string(&log_array[0]);

					testCtx.getLog() << tcu::TestLog::Message << "Shader compilation has failed.\n"
									 << "Shader type: " << shaders_configuration[n_shader_index].type << "\n"
									 << "Shader compilation error log:\n"
									 << log_string << "\n"
									 << "Shader source code:\n"
									 << shaders_configuration[n_shader_index].body << "\n"
									 << tcu::TestLog::EndMessage;

					TCU_FAIL("Shader compilation has failed.");
				}

				/* Also attach the shader to the corresponding program object */
				gl.attachShader(po_id, so_id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed");
			} /* if (shaders_configuration[n_shader_index].body != DE_NULL) */
		}	 /* for (all shader object IDs) */

		/* Set transform feedback if requested */
		if (n_tf_varyings > 0)
		{
			gl.transformFeedbackVaryings(po_id, n_tf_varyings, tf_varyings, GL_INTERLEAVED_ATTRIBS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");
		}

		/* Try to link the program objects */
		if (po_id != 0)
		{
			glw::GLint link_status = GL_FALSE;

			gl.linkProgram(po_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed");

			gl.getProgramiv(po_id, GL_LINK_STATUS, &link_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

			if (link_status == GL_FALSE)
			{
				std::vector<glw::GLchar> log_array(1);
				glw::GLsizei			 log_length = 0;
				std::string				 log_string;

				/* Retreive compilation log length */
				gl.getProgramiv(po_id, GL_INFO_LOG_LENGTH, &log_length);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

				log_array.resize(log_length + 1, 0);

				/* Retreive compilation log */
				gl.getProgramInfoLog(po_id, log_length, DE_NULL, &log_array[0]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog() call failed.");

				log_string = std::string(&log_array[0]);

				/* Log linking error message */
				testCtx.getLog() << tcu::TestLog::Message << "Program linking has failed.\n"
								 << "Linking error log:\n"
								 << log_string << "\n"
								 << tcu::TestLog::EndMessage;

				/* Log shader source code of shaders involved */
				for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
				{
					if (shaders_configuration[n_shader_index].body != DE_NULL)
					{
						testCtx.getLog() << tcu::TestLog::Message << "Shader source code of type "
										 << shaders_configuration[n_shader_index].type << " follows:\n"
										 << shaders_configuration[n_shader_index].body << "\n"
										 << tcu::TestLog::EndMessage;
					}
				}

				TCU_FAIL("Program linking failed");
			}
		} /* if (po_id != 0) */

		/* Delete all shaders we've created */
		for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
		{
			const glw::GLuint so_id = shaders_configuration[n_shader_index].id;

			if (so_id != 0)
			{
				gl.deleteShader(so_id);

				shaders_configuration[n_shader_index].id = 0;

				GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed.");
			}
		}

		/* Store the result progrtam IDs */
		*out_program = po_id;
	}
	catch (...)
	{
		/* Delete all shaders we've created */
		for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
		{
			const glw::GLuint so_id = shaders_configuration[n_shader_index].id;

			if (so_id != 0)
			{
				gl.deleteShader(so_id);

				shaders_configuration[n_shader_index].id = 0;
			}
		}

		/* Delete the program object */
		if (po_id != 0)
		{
			gl.deleteProgram(po_id);

			po_id = 0;
		}

		/* Rethrow */
		throw;
	}
}